

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

void __thiscall DElevator::Destroy(DElevator *this)

{
  bool bVar1;
  DInterpolation *pDVar2;
  DElevator *this_local;
  
  bVar1 = TObjPtr<DInterpolation>::operator!=(&this->m_Interp_Ceiling,(DInterpolation *)0x0);
  if (bVar1) {
    pDVar2 = TObjPtr<DInterpolation>::operator->(&this->m_Interp_Ceiling);
    DInterpolation::DelRef(pDVar2,false);
    TObjPtr<DInterpolation>::operator=(&this->m_Interp_Ceiling,(DInterpolation *)0x0);
  }
  bVar1 = TObjPtr<DInterpolation>::operator!=(&this->m_Interp_Floor,(DInterpolation *)0x0);
  if (bVar1) {
    pDVar2 = TObjPtr<DInterpolation>::operator->(&this->m_Interp_Floor);
    DInterpolation::DelRef(pDVar2,false);
    TObjPtr<DInterpolation>::operator=(&this->m_Interp_Floor,(DInterpolation *)0x0);
  }
  DMover::Destroy(&this->super_DMover);
  return;
}

Assistant:

void DElevator::Destroy()
{
	if (m_Interp_Ceiling != NULL)
	{
		m_Interp_Ceiling->DelRef();
		m_Interp_Ceiling = NULL;
	}
	if (m_Interp_Floor != NULL)
	{
		m_Interp_Floor->DelRef();
		m_Interp_Floor = NULL;
	}
	Super::Destroy();
}